

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

HelicsBroker helicsCreateBrokerFromArgs(char *type,char *name,int argc,char **argv,HelicsError *err)

{
  CoreType CVar1;
  core *this;
  char *pcVar2;
  char *extraout_RDX;
  char **__args;
  _Alloc_hider _Var3;
  int iVar4;
  string_view type_00;
  string_view newError;
  string_view brokerName;
  __single_object broker;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  allocator<char> local_c1;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  MasterObjectHolder *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (type == (char *)0x0) {
      CVar1 = DEFAULT;
    }
    else {
      this = (core *)strlen(type);
      type_00._M_str = extraout_RDX;
      type_00._M_len = (size_t)type;
      CVar1 = helics::core::coreTypeFromString(this,type_00);
      if (CVar1 == UNRECOGNIZED) {
        if (err != (HelicsError *)0x0) {
          err->error_code = -4;
          getMasterHolder();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"core type ",&local_c1);
          std::operator+(&local_98,&local_b8,type);
          std::operator+(&local_78,&local_98," is not recognized");
          newError._M_str = local_78._M_dataplus._M_p;
          newError._M_len = local_78._M_string_length;
          pcVar2 = MasterObjectHolder::addErrorString(local_58,newError);
          err->message = pcVar2;
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        }
        goto LAB_00175963;
      }
    }
    std::make_unique<helics::BrokerObject>();
    local_b8._M_dataplus._M_p[0x14] = ' ';
    local_b8._M_dataplus._M_p[0x15] = '}';
    local_b8._M_dataplus._M_p[0x16] = 'F';
    local_b8._M_dataplus._M_p[0x17] = -0x5d;
    local_78.field_2._M_allocated_capacity = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78,(long)argc - 1);
    iVar4 = argc + 1;
    __args = argv + (uint)argc;
    while( true ) {
      __args = __args + -1;
      iVar4 = iVar4 + -1;
      if (iVar4 < 2) break;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 __args);
    }
    _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    pcVar2 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
    if (name != (char *)0x0) {
      pcVar2 = (char *)strlen(name);
      _Var3._M_p = name;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_78);
    brokerName._M_len = (ulong)CVar1;
    brokerName._M_str = pcVar2;
    helics::BrokerFactory::create
              ((CoreType)&local_98,brokerName,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)_Var3._M_p);
    std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)local_b8._M_dataplus._M_p
               ,(__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    _Var3._M_p = local_b8._M_dataplus._M_p;
    getMasterHolder();
    local_c0._M_t.
    super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>.
    super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl =
         (__uniq_ptr_data<helics::BrokerObject,_std::default_delete<helics::BrokerObject>,_true,_true>
          )(__uniq_ptr_data<helics::BrokerObject,_std::default_delete<helics::BrokerObject>,_true,_true>
            )local_b8._M_dataplus._M_p;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    MasterObjectHolder::addBroker((MasterObjectHolder *)local_98._M_dataplus._M_p,&local_c0);
    std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::~unique_ptr
              (&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
    std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::~unique_ptr
              ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)
               &local_b8);
  }
  else {
LAB_00175963:
    _Var3._M_p = (pointer)0x0;
  }
  return (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p;
}

Assistant:

HelicsBroker helicsCreateBrokerFromArgs(const char* type, const char* name, int argc, const char* const* argv, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    const helics::CoreType coretype = (type != nullptr) ? helics::core::coreTypeFromString(type) : helics::CoreType::DEFAULT;

    if (coretype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string("core type ") + type + " is not recognized");
        }
        return nullptr;
    }
    auto broker = std::make_unique<helics::BrokerObject>();
    broker->valid = gBrokerValidationIdentifier;
    try {
        std::vector<std::string> args;
        args.reserve(static_cast<size_t>(argc) - 1);
        for (int ii = argc - 1; ii > 0; ii--) {
            args.emplace_back(argv[ii]);
        }
        broker->brokerptr = helics::BrokerFactory::create(coretype, AS_STRING_VIEW(name), args);
        auto* retbroker = reinterpret_cast<HelicsBroker>(broker.get());
        getMasterHolder()->addBroker(std::move(broker));
        return retbroker;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}